

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O1

size_t __thiscall SymbolData::addFileName(SymbolData *this,string *fileName)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_type *psVar6;
  size_t sVar7;
  bool bVar8;
  
  pbVar1 = (this->files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar8 = lVar4 != 0;
  if (bVar8) {
    uVar5 = lVar4 >> 5;
    __s2 = (fileName->_M_dataplus)._M_p;
    sVar2 = fileName->_M_string_length;
    psVar6 = &pbVar1->_M_string_length;
    sVar7 = 0;
    do {
      __n = *psVar6;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar6 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        if (bVar8) {
          return sVar7;
        }
        break;
      }
      sVar7 = sVar7 + 1;
      bVar8 = sVar7 < uVar5;
      psVar6 = psVar6 + 4;
    } while (uVar5 + (uVar5 == 0) != sVar7);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->files,fileName);
  return ((long)(this->files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
}

Assistant:

size_t SymbolData::addFileName(const std::string& fileName)
{
	for (size_t i = 0; i < files.size(); i++)
	{
		if (files[i] == fileName)
			return i;
	}

	files.push_back(fileName);
	return files.size()-1;
}